

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O2

void __thiscall
myvk::Buffer::UpdateData<Camera::UniformData>(Buffer *this,UniformData *data,uint32_t byte_offset)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  ulong uVar10;
  
  pvVar9 = this->m_mapped_ptr;
  if (pvVar9 != (void *)0x0) {
    uVar10 = (ulong)byte_offset;
    uVar2 = *(undefined8 *)&data->m_position;
    uVar3 = *(undefined8 *)&(data->m_position).field_2;
    uVar4 = *(undefined8 *)&data->m_look;
    uVar5 = *(undefined8 *)&(data->m_look).field_2;
    uVar6 = *(undefined8 *)&data->m_side;
    uVar7 = *(undefined8 *)&(data->m_side).field_2;
    uVar8 = *(undefined8 *)&(data->m_up).field_2;
    puVar1 = (undefined8 *)((long)pvVar9 + uVar10 + 0x30);
    *puVar1 = *(undefined8 *)&data->m_up;
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)((long)pvVar9 + uVar10 + 0x20);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)pvVar9 + uVar10 + 0x10);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    *(undefined8 *)((long)pvVar9 + uVar10) = uVar2;
    ((undefined8 *)((long)pvVar9 + uVar10))[1] = uVar3;
    return;
  }
  pvVar9 = Map(this);
  uVar10 = (ulong)byte_offset;
  uVar2 = *(undefined8 *)&(data->m_position).field_2;
  uVar3 = *(undefined8 *)&data->m_look;
  uVar4 = *(undefined8 *)&(data->m_look).field_2;
  uVar5 = *(undefined8 *)&data->m_side;
  uVar6 = *(undefined8 *)&(data->m_side).field_2;
  uVar7 = *(undefined8 *)&data->m_up;
  uVar8 = *(undefined8 *)&(data->m_up).field_2;
  *(undefined8 *)((long)pvVar9 + uVar10) = *(undefined8 *)&data->m_position;
  ((undefined8 *)((long)pvVar9 + uVar10))[1] = uVar2;
  puVar1 = (undefined8 *)((long)pvVar9 + uVar10 + 0x30);
  *puVar1 = uVar7;
  puVar1[1] = uVar8;
  puVar1 = (undefined8 *)((long)pvVar9 + uVar10 + 0x20);
  *puVar1 = uVar5;
  puVar1[1] = uVar6;
  puVar1 = (undefined8 *)((long)pvVar9 + uVar10 + 0x10);
  *puVar1 = uVar3;
  puVar1[1] = uVar4;
  Unmap(this);
  return;
}

Assistant:

inline void UpdateData(const T &data, uint32_t byte_offset = 0) const {
		if (m_mapped_ptr) {
			std::copy(&data, &data + 1, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(&data, &data + 1, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}